

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O0

ggml_tensor * __thiscall llm_graph_context::build_inp_s_mask(llm_graph_context *this)

{
  pointer plVar1;
  ggml_tensor *pgVar2;
  pointer __u;
  long in_RDI;
  ggml_tensor **cur;
  uint32_t n_kv;
  __single_object inp;
  llama_kv_cache_unified *kv_self;
  llm_graph_input_ptr *in_stack_ffffffffffffff88;
  llm_graph_result *in_stack_ffffffffffffff90;
  unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_40 [3];
  ggml_tensor **local_28;
  undefined4 local_1c;
  llama_kv_cache_unified *local_18;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0xe8);
  std::make_unique<llm_graph_input_s_mask,llama_kv_cache_unified_const*&>(&local_18);
  local_1c = *(undefined4 *)(local_10 + 0x74);
  plVar1 = std::unique_ptr<llm_graph_input_s_mask,_std::default_delete<llm_graph_input_s_mask>_>::
           operator->((unique_ptr<llm_graph_input_s_mask,_std::default_delete<llm_graph_input_s_mask>_>
                       *)0x434f09);
  local_28 = &plVar1->s_mask;
  pgVar2 = (ggml_tensor *)ggml_new_tensor_2d(*(undefined8 *)(in_RDI + 0xc0),0,1,local_1c);
  *local_28 = pgVar2;
  ggml_set_input(*local_28);
  __u = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                  ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)0x434f67)
  ;
  std::unique_ptr<llm_graph_input_i,std::default_delete<llm_graph_input_i>>::
  unique_ptr<llm_graph_input_s_mask,std::default_delete<llm_graph_input_s_mask>,void>
            (local_40,(unique_ptr<llm_graph_input_s_mask,_std::default_delete<llm_graph_input_s_mask>_>
                       *)__u);
  llm_graph_result::add_input(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> *)
             in_stack_ffffffffffffff90);
  pgVar2 = *local_28;
  std::unique_ptr<llm_graph_input_s_mask,_std::default_delete<llm_graph_input_s_mask>_>::~unique_ptr
            ((unique_ptr<llm_graph_input_s_mask,_std::default_delete<llm_graph_input_s_mask>_> *)
             pgVar2);
  return pgVar2;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_s_mask() const {
    const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

    auto inp = std::make_unique<llm_graph_input_s_mask>(kv_self);

    const auto n_kv = kv_self->n;

    auto & cur = inp->s_mask;

    cur = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, 1, n_kv);
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}